

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllDomains(Registry *this,DomainArray *aRet)

{
  PersistentStorage *pPVar1;
  int iVar2;
  Domain local_48;
  Status local_19;
  DomainArray *pDStack_18;
  Status status;
  DomainArray *aRet_local;
  Registry *this_local;
  
  pPVar1 = this->mStorage;
  pDStack_18 = aRet;
  aRet_local = (DomainArray *)this;
  Domain::Domain(&local_48);
  iVar2 = (*pPVar1->_vptr_PersistentStorage[0x15])(pPVar1,&local_48,pDStack_18);
  local_19 = anon_unknown_0::MapStatus((Status)iVar2);
  Domain::~Domain(&local_48);
  return local_19;
}

Assistant:

Registry::Status Registry::GetAllDomains(DomainArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Domain{}, aRet));

    return status;
}